

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::transform_mcu(jpeg_decoder *this,int mcu_row)

{
  uint8 *pDst_ptr;
  byte bVar1;
  uint uVar2;
  jpgd_block_coeff_t *pjVar3;
  uint8 *puVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  jpgd_block_coeff_t *pInput;
  short *pSrc;
  int *piVar8;
  uint8_t *pOutputUB;
  long lVar9;
  int local_138 [66];
  
  iVar5 = this->m_blocks_per_mcu;
  if (this->m_max_blocks_per_row <= mcu_row * iVar5) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  pjVar3 = this->m_pMCU_coefficients;
  puVar4 = this->m_pSample_buf;
  pOutputUB = puVar4 + mcu_row * iVar5 * 0x40;
  lVar9 = 0;
  pInput = pjVar3;
  do {
    piVar8 = local_138;
    if (iVar5 <= lVar9) {
      return;
    }
    uVar2 = this->m_mcu_block_max_zag[lVar9];
    if ((int)uVar2 < 1) {
      __assert_fail("block_max_zag >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x11f,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
    }
    if (0x40 < uVar2) {
      __assert_fail("block_max_zag <= 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x120,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
    }
    if (uVar2 == 1) {
      iVar6 = *pInput + 4 >> 3;
      iVar5 = 0;
      if (-0x81 < iVar6) {
        iVar5 = 0xff;
      }
      if ((char)iVar6 == iVar6) {
        iVar5 = iVar6 + 0x80;
      }
      for (lVar7 = 0; (int)lVar7 != 8; lVar7 = lVar7 + 1) {
        *(int *)(pOutputUB + lVar7 * 8) = iVar5 * 0x1010101;
        *(int *)(pOutputUB + lVar7 * 8 + 4) = iVar5 * 0x1010101;
      }
    }
    else if (((this->m_flags & 2) == 0 & this->m_has_sse2) == 0) {
      pSrc = pInput;
      for (lVar7 = 0; (int)lVar7 != 8; lVar7 = lVar7 + 1) {
        switch(s_idct_row_table[(ulong)(uVar2 * 8 - 8) + lVar7]) {
        case 1:
          Row<1>::idct(piVar8,pSrc);
          break;
        case 2:
          Row<2>::idct(piVar8,pSrc);
          break;
        case 3:
          Row<3>::idct(piVar8,pSrc);
          break;
        case 4:
          Row<4>::idct(piVar8,pSrc);
          break;
        case 5:
          Row<5>::idct(piVar8,pSrc);
          break;
        case 6:
          Row<6>::idct(piVar8,pSrc);
          break;
        case 7:
          Row<7>::idct(piVar8,pSrc);
          break;
        case 8:
          Row<8>::idct(piVar8,pSrc);
        }
        pSrc = pSrc + 8;
        piVar8 = piVar8 + 8;
      }
      bVar1 = s_idct_col_table[uVar2 - 1];
      piVar8 = local_138;
      for (lVar7 = 0; (int)lVar7 != 8; lVar7 = lVar7 + 1) {
        if (bVar1 - 1 < 8) {
          pDst_ptr = pOutputUB + lVar7;
          switch((uint)bVar1) {
          case 1:
            Col<1>::idct(pDst_ptr,piVar8);
            break;
          case 2:
            Col<2>::idct(pDst_ptr,piVar8);
            break;
          case 3:
            Col<3>::idct(pDst_ptr,piVar8);
            break;
          case 4:
            Col<4>::idct(pDst_ptr,piVar8);
            break;
          case 5:
            Col<5>::idct(pDst_ptr,piVar8);
            break;
          case 6:
            Col<6>::idct(pDst_ptr,piVar8);
            break;
          case 7:
            Col<7>::idct(pDst_ptr,piVar8);
            break;
          case 8:
            Col<8>::idct(pDst_ptr,piVar8);
          }
        }
        piVar8 = piVar8 + 1;
      }
    }
    else {
      if (((ulong)pjVar3 & 0xf) != 0) {
        __assert_fail("(((uintptr_t)pSrc_ptr) & 15) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x135,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
      }
      if (((ulong)puVar4 & 0xf) != 0) {
        __assert_fail("(((uintptr_t)pDst_ptr) & 15) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x136,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
      }
      idctSSEShortU8(pInput,pOutputUB);
    }
    pInput = pInput + 0x40;
    pOutputUB = pOutputUB + 0x40;
    lVar9 = lVar9 + 1;
    iVar5 = this->m_blocks_per_mcu;
  } while( true );
}

Assistant:

void jpeg_decoder::transform_mcu(int mcu_row)
	{
		jpgd_block_coeff_t* pSrc_ptr = m_pMCU_coefficients;
		if (mcu_row * m_blocks_per_mcu >= m_max_blocks_per_row)
			stop_decoding(JPGD_DECODE_ERROR);

		uint8* pDst_ptr = m_pSample_buf + mcu_row * m_blocks_per_mcu * 64;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			idct(pSrc_ptr, pDst_ptr, m_mcu_block_max_zag[mcu_block], ((m_flags & cFlagDisableSIMD) == 0) && m_has_sse2);
			pSrc_ptr += 64;
			pDst_ptr += 64;
		}
	}